

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

SmallVectorImpl<ParserError> * __thiscall
llvm_vecsmall::SmallVectorImpl<ParserError>::operator=
          (SmallVectorImpl<ParserError> *this,SmallVectorImpl<ParserError> *RHS)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 uVar3;
  ulong uVar4;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  ulong uVar8;
  long *plVar9;
  long lVar10;
  ulong MinSize;
  long lVar11;
  
  if (this != RHS) {
    plVar5 = (long *)(RHS->super_SmallVectorTemplateBase<ParserError,_false>).
                     super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.BeginX
    ;
    pvVar2 = (RHS->super_SmallVectorTemplateBase<ParserError,_false>).
             super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.EndX;
    uVar6 = (long)pvVar2 - (long)plVar5;
    MinSize = ((long)uVar6 >> 4) * -0x5555555555555555;
    plVar7 = (long *)(this->super_SmallVectorTemplateBase<ParserError,_false>).
                     super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.BeginX
    ;
    plVar9 = (long *)(this->super_SmallVectorTemplateBase<ParserError,_false>).
                     super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.EndX;
    uVar4 = (long)plVar9 - (long)plVar7;
    uVar8 = ((long)uVar4 >> 4) * -0x5555555555555555;
    if (uVar8 < MinSize) {
      if ((ulong)((long)(this->super_SmallVectorTemplateBase<ParserError,_false>).
                        super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.
                        CapacityX - (long)plVar7) < uVar6) {
        if (plVar9 != plVar7) {
          plVar5 = plVar9 + -2;
          do {
            if (plVar5 != (long *)plVar5[-2]) {
              operator_delete((long *)plVar5[-2],*plVar5 + 1);
            }
            plVar9 = plVar5 + -4;
            plVar5 = plVar5 + -6;
          } while (plVar9 != plVar7);
        }
        (this->super_SmallVectorTemplateBase<ParserError,_false>).
        super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.EndX =
             (this->super_SmallVectorTemplateBase<ParserError,_false>).
             super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.BeginX;
        SmallVectorTemplateBase<ParserError,_false>::grow
                  (&this->super_SmallVectorTemplateBase<ParserError,_false>,MinSize);
        uVar8 = 0;
      }
      else if (plVar9 == plVar7) {
        uVar8 = 0;
      }
      else if (0 < (long)uVar4) {
        lVar11 = uVar4 / 0x30 + 1;
        lVar10 = 0;
        do {
          uVar3 = ((undefined8 *)(lVar10 + (long)plVar5))[1];
          puVar1 = (undefined8 *)((long)plVar7 + lVar10);
          *puVar1 = *(undefined8 *)(lVar10 + (long)plVar5);
          puVar1[1] = uVar3;
          std::__cxx11::string::_M_assign((string *)(puVar1 + 2));
          lVar11 = lVar11 + -1;
          lVar10 = lVar10 + 0x30;
        } while (1 < lVar11);
      }
      std::__uninitialized_copy<false>::__uninit_copy<ParserError_const*,ParserError*>
                ((ParserError *)
                 ((long)(RHS->super_SmallVectorTemplateBase<ParserError,_false>).
                        super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.
                        BeginX + uVar8 * 0x30),
                 (ParserError *)
                 (RHS->super_SmallVectorTemplateBase<ParserError,_false>).
                 super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.EndX,
                 (ParserError *)
                 (uVar8 * 0x30 +
                 (long)(this->super_SmallVectorTemplateBase<ParserError,_false>).
                       super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.
                       BeginX));
      plVar7 = (long *)(uVar6 + (long)(this->super_SmallVectorTemplateBase<ParserError,_false>).
                                      super_SmallVectorTemplateCommon<ParserError,_void>.
                                      super_SmallVectorBase.BeginX);
    }
    else {
      uVar4 = (long)pvVar2 - (long)plVar5;
      if ((uVar4 != 0) && (0 < (long)uVar4)) {
        lVar10 = uVar4 / 0x30 + 1;
        do {
          lVar11 = plVar5[1];
          *plVar7 = *plVar5;
          plVar7[1] = lVar11;
          std::__cxx11::string::_M_assign((string *)(plVar7 + 2));
          plVar7 = plVar7 + 6;
          lVar10 = lVar10 + -1;
          plVar5 = plVar5 + 6;
        } while (1 < lVar10);
      }
      plVar5 = (long *)(this->super_SmallVectorTemplateBase<ParserError,_false>).
                       super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.EndX
      ;
      if (plVar5 != plVar7) {
        plVar5 = plVar5 + -2;
        do {
          if (plVar5 != (long *)plVar5[-2]) {
            operator_delete((long *)plVar5[-2],*plVar5 + 1);
          }
          plVar9 = plVar5 + -4;
          plVar5 = plVar5 + -6;
        } while (plVar9 != plVar7);
      }
    }
    (this->super_SmallVectorTemplateBase<ParserError,_false>).
    super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.EndX = plVar7;
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->setEnd(NewEnd);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);
  return *this;
}